

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BaseMap_Read(TFileStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,DWORD dwBytesToRead)

{
  ULONGLONG local_40;
  ULONGLONG ByteOffset;
  DWORD dwBytesToRead_local;
  void *pvBuffer_local;
  ULONGLONG *pByteOffset_local;
  TFileStream *pStream_local;
  
  if (pByteOffset == (ULONGLONG *)0x0) {
    local_40 = (pStream->Base).File.FilePos;
  }
  else {
    local_40 = *pByteOffset;
  }
  if (dwBytesToRead != 0) {
    if ((pStream->Base).File.FileSize < local_40 + dwBytesToRead) {
      return false;
    }
    memcpy(pvBuffer,(void *)((long)(pStream->Base).File.hFile + local_40),(ulong)dwBytesToRead);
  }
  (pStream->Base).File.FilePos = (ulong)dwBytesToRead + (pStream->Base).File.FilePos;
  return true;
}

Assistant:

static bool BaseMap_Read(
    TFileStream * pStream,                  // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG ByteOffset = (pByteOffset != NULL) ? *pByteOffset : pStream->Base.Map.FilePos;

    // Do we have to read anything at all?
    if(dwBytesToRead != 0)
    {
        // Don't allow reading past file size
        if((ByteOffset + dwBytesToRead) > pStream->Base.Map.FileSize)
            return false;

        // Copy the required data
        memcpy(pvBuffer, pStream->Base.Map.pbFile + (size_t)ByteOffset, dwBytesToRead);
    }

    // Move the current file position
    pStream->Base.Map.FilePos += dwBytesToRead;
    return true;
}